

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

double __thiscall llvm::APInt::trunc(APInt *this,double __x)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  sbyte sVar3;
  uint in_EDX;
  uint64_t *in_RSI;
  ulong uVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  
  if ((uint)in_RSI[1] <= in_EDX) {
    __assert_fail("width < BitWidth && \"Invalid APInt Truncate request\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x332,"APInt llvm::APInt::trunc(unsigned int) const");
  }
  if (in_EDX != 0) {
    if (in_EDX < 0x41) {
      if (0x40 < (uint)in_RSI[1]) {
        in_RSI = (uint64_t *)*in_RSI;
      }
      APInt(this,in_EDX,*in_RSI,false);
      dVar5 = extraout_XMM0_Qa;
    }
    else {
      puVar2 = (uint64_t *)operator_new__((ulong)((uint)((ulong)in_EDX + 0x3f >> 3) & 0xfffffff8));
      this->BitWidth = in_EDX;
      (this->U).pVal = puVar2;
      uVar1 = *in_RSI;
      uVar4 = 0;
      do {
        puVar2[uVar4] = *(uint64_t *)(uVar1 + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while (in_EDX >> 6 != uVar4);
      dVar5 = extraout_XMM0_Qa_00;
      if ((-in_EDX & 0x3f) != 0) {
        uVar4 = (ulong)((in_EDX >> 6) << 3);
        sVar3 = (sbyte)(-in_EDX & 0x3f);
        *(ulong *)((long)puVar2 + uVar4) = (ulong)(*(long *)(*in_RSI + uVar4) << sVar3) >> sVar3;
      }
    }
    return dVar5;
  }
  __assert_fail("width && \"Can\'t truncate to 0 bits\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x333,"APInt llvm::APInt::trunc(unsigned int) const");
}

Assistant:

APInt APInt::trunc(unsigned width) const {
  assert(width < BitWidth && "Invalid APInt Truncate request");
  assert(width && "Can't truncate to 0 bits");

  if (width <= APINT_BITS_PER_WORD)
    return APInt(width, getRawData()[0]);

  APInt Result(getMemory(getNumWords(width)), width);

  // Copy full words.
  unsigned i;
  for (i = 0; i != width / APINT_BITS_PER_WORD; i++)
    Result.U.pVal[i] = U.pVal[i];

  // Truncate and copy any partial word.
  unsigned bits = (0 - width) % APINT_BITS_PER_WORD;
  if (bits != 0)
    Result.U.pVal[i] = U.pVal[i] << bits >> bits;

  return Result;
}